

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::TraitImplExpr::~TraitImplExpr(TraitImplExpr *this)

{
  ~TraitImplExpr(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TraitImplExpr::~TraitImplExpr() {
}